

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O1

string * trim(string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  int iVar2;
  size_type sVar3;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + s->_M_string_length);
  if (__return_storage_ptr__->_M_string_length != 0) {
    do {
      iVar2 = isspace((int)*(__return_storage_ptr__->_M_dataplus)._M_p);
      if (iVar2 == 0) break;
      std::__cxx11::string::substr((ulong)local_48,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
      }
    } while (__return_storage_ptr__->_M_string_length != 0);
  }
  sVar3 = __return_storage_ptr__->_M_string_length;
  if (sVar3 != 0) {
    do {
      iVar2 = isspace((int)(__return_storage_ptr__->_M_dataplus)._M_p[sVar3 - 1]);
      if (iVar2 == 0) {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::substr((ulong)local_48,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
      }
      sVar3 = __return_storage_ptr__->_M_string_length;
    } while (sVar3 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string trim(const std::string &s)
{
    std::string out = s;
    while (not out.empty() and std::isspace(out[0])) out = out.substr(1);
    while (not out.empty() and std::isspace(out[out.size()-1])) out = out.substr(0, out.size()-1);
    return out;
}